

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_base(parser *p)

{
  void *pvVar1;
  char *name;
  monster_base *pmVar2;
  monster_race *r;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  name = parser_getsym(p,"base");
  pmVar2 = lookup_monster_base(name);
  *(monster_base **)((long)pvVar1 + 0x28) = pmVar2;
  if (*(long *)((long)pvVar1 + 0x28) == 0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_MONSTER_BASE;
  }
  else {
    *(undefined4 *)((long)pvVar1 + 0x8c) = *(undefined4 *)(*(long *)((long)pvVar1 + 0x28) + 0x24);
    flag_union((bitflag *)((long)pvVar1 + 0x5c),(bitflag *)(*(long *)((long)pvVar1 + 0x28) + 0x18),
               0xb);
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_monster_base(struct parser *p) {
	struct monster_race *r = parser_priv(p);

	r->base = lookup_monster_base(parser_getsym(p, "base"));
	if (r->base == NULL)
		return PARSE_ERROR_INVALID_MONSTER_BASE;

	/* The template sets the default display character */
	r->d_char = r->base->d_char;

	/* Give the monster its default flags */
	rf_union(r->flags, r->base->flags);

	return PARSE_ERROR_NONE;
}